

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMergeEngineStep(MergeEngine *pMerger,int *pbEof)

{
  uint local_4c;
  int local_48;
  int local_44;
  int iRes;
  int bCached;
  PmaReader *pReadr2;
  PmaReader *pReadr1;
  SortSubtask *pSStack_28;
  int i;
  SortSubtask *pTask;
  int iPrev;
  int rc;
  int *pbEof_local;
  MergeEngine *pMerger_local;
  
  pTask._0_4_ = pMerger->aTree[1];
  pSStack_28 = pMerger->pTask;
  _iPrev = (uint *)pbEof;
  pbEof_local = &pMerger->nTree;
  pTask._4_4_ = vdbePmaReaderNext(pMerger->aReadr + (int)(uint)pTask);
  if (pTask._4_4_ == 0) {
    local_44 = 0;
    pReadr2 = (PmaReader *)(*(long *)(pbEof_local + 6) + (long)(int)((uint)pTask & 0xfffe) * 0x50);
    _iRes = (PmaReader *)(*(long *)(pbEof_local + 6) + (long)(int)((uint)pTask | 1) * 0x50);
    pReadr1._4_4_ = *pbEof_local + (uint)pTask;
    while (pReadr1._4_4_ = (int)pReadr1._4_4_ / 2, 0 < (int)pReadr1._4_4_) {
      if (pReadr2->pFd == (sqlite3_file *)0x0) {
        local_48 = 1;
      }
      else if (_iRes->pFd == (sqlite3_file *)0x0) {
        local_48 = -1;
      }
      else {
        local_48 = (*pSStack_28->xCompare)
                             (pSStack_28,&local_44,pReadr2->aKey,pReadr2->nKey,_iRes->aKey,
                              _iRes->nKey);
      }
      if ((local_48 < 0) || ((local_48 == 0 && (pReadr2 < _iRes)))) {
        *(int *)(*(long *)(pbEof_local + 4) + (long)(int)pReadr1._4_4_ * 4) =
             (int)(((long)pReadr2 - *(long *)(pbEof_local + 6)) / 0x50);
        _iRes = (PmaReader *)
                (*(long *)(pbEof_local + 6) +
                (long)*(int *)(*(long *)(pbEof_local + 4) + (long)(int)(pReadr1._4_4_ ^ 1) * 4) *
                0x50);
        local_44 = 0;
      }
      else {
        if (pReadr2->pFd != (sqlite3_file *)0x0) {
          local_44 = 0;
        }
        *(int *)(*(long *)(pbEof_local + 4) + (long)(int)pReadr1._4_4_ * 4) =
             (int)(((long)_iRes - *(long *)(pbEof_local + 6)) / 0x50);
        pReadr2 = (PmaReader *)
                  (*(long *)(pbEof_local + 6) +
                  (long)*(int *)(*(long *)(pbEof_local + 4) + (long)(int)(pReadr1._4_4_ ^ 1) * 4) *
                  0x50);
      }
    }
    *_iPrev = (uint)(*(long *)(*(long *)(pbEof_local + 6) +
                               (long)*(int *)(*(long *)(pbEof_local + 4) + 4) * 0x50 + 0x18) == 0);
  }
  if (pTask._4_4_ == 0) {
    local_4c = (uint)pSStack_28->pUnpacked->errCode;
  }
  else {
    local_4c = pTask._4_4_;
  }
  return local_4c;
}

Assistant:

static int vdbeMergeEngineStep(
  MergeEngine *pMerger,      /* The merge engine to advance to the next row */
  int *pbEof                 /* Set TRUE at EOF.  Set false for more content */
){
  int rc;
  int iPrev = pMerger->aTree[1];/* Index of PmaReader to advance */
  SortSubtask *pTask = pMerger->pTask;

  /* Advance the current PmaReader */
  rc = vdbePmaReaderNext(&pMerger->aReadr[iPrev]);

  /* Update contents of aTree[] */
  if( rc==SQLITE_OK ){
    int i;                      /* Index of aTree[] to recalculate */
    PmaReader *pReadr1;         /* First PmaReader to compare */
    PmaReader *pReadr2;         /* Second PmaReader to compare */
    int bCached = 0;

    /* Find the first two PmaReaders to compare. The one that was just
    ** advanced (iPrev) and the one next to it in the array.  */
    pReadr1 = &pMerger->aReadr[(iPrev & 0xFFFE)];
    pReadr2 = &pMerger->aReadr[(iPrev | 0x0001)];

    for(i=(pMerger->nTree+iPrev)/2; i>0; i=i/2){
      /* Compare pReadr1 and pReadr2. Store the result in variable iRes. */
      int iRes;
      if( pReadr1->pFd==0 ){
        iRes = +1;
      }else if( pReadr2->pFd==0 ){
        iRes = -1;
      }else{
        iRes = pTask->xCompare(pTask, &bCached,
            pReadr1->aKey, pReadr1->nKey, pReadr2->aKey, pReadr2->nKey
        );
      }

      /* If pReadr1 contained the smaller value, set aTree[i] to its index.
      ** Then set pReadr2 to the next PmaReader to compare to pReadr1. In this
      ** case there is no cache of pReadr2 in pTask->pUnpacked, so set
      ** pKey2 to point to the record belonging to pReadr2.
      **
      ** Alternatively, if pReadr2 contains the smaller of the two values,
      ** set aTree[i] to its index and update pReadr1. If vdbeSorterCompare()
      ** was actually called above, then pTask->pUnpacked now contains
      ** a value equivalent to pReadr2. So set pKey2 to NULL to prevent
      ** vdbeSorterCompare() from decoding pReadr2 again.
      **
      ** If the two values were equal, then the value from the oldest
      ** PMA should be considered smaller. The VdbeSorter.aReadr[] array
      ** is sorted from oldest to newest, so pReadr1 contains older values
      ** than pReadr2 iff (pReadr1<pReadr2).  */
      if( iRes<0 || (iRes==0 && pReadr1<pReadr2) ){
        pMerger->aTree[i] = (int)(pReadr1 - pMerger->aReadr);
        pReadr2 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
        bCached = 0;
      }else{
        if( pReadr1->pFd ) bCached = 0;
        pMerger->aTree[i] = (int)(pReadr2 - pMerger->aReadr);
        pReadr1 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
      }
    }
    *pbEof = (pMerger->aReadr[pMerger->aTree[1]].pFd==0);
  }

  return (rc==SQLITE_OK ? pTask->pUnpacked->errCode : rc);
}